

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::GenStructArgs
          (TsGenerator *this,import_set *imports,StructDef *struct_def,string *arguments,
          string *nameprefix)

{
  StructDef *struct_def_00;
  FieldDef *owner;
  bool bVar1;
  reference ppFVar2;
  Value *type;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  FieldDef *local_48;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_38;
  const_iterator it;
  string *nameprefix_local;
  string *arguments_local;
  StructDef *struct_def_local;
  import_set *imports_local;
  TsGenerator *this_local;
  
  it._M_current = (FieldDef **)nameprefix;
  local_38._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppFVar2;
    bVar1 = IsStruct(&(local_48->value).type);
    if (bVar1) {
      struct_def_00 = (local_48->value).type.struct_def;
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     it._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_68,&local_88,"_");
      GenStructArgs(this,imports,struct_def_00,arguments,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::operator+(&local_118,", ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     it._M_current);
      std::operator+(&local_f8,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_d8,&local_f8,": ");
      owner = local_48;
      type = &local_48->value;
      bVar1 = FieldDef::IsOptional(local_48);
      GenTypeName(&local_138,this,imports,&owner->super_Definition,&type->type,true,bVar1);
      std::operator+(&local_b8,&local_d8,&local_138);
      std::__cxx11::string::operator+=((string *)arguments,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void GenStructArgs(import_set &imports, const StructDef &struct_def,
                     std::string *arguments, const std::string &nameprefix) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(imports, *field.value.type.struct_def, arguments,
                      nameprefix + field.name + "_");
      } else {
        *arguments += ", " + nameprefix + field.name + ": " +
                      GenTypeName(imports, field, field.value.type, true,
                                  field.IsOptional());
      }
    }
  }